

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPML_DIGEST_VALUES_Unmarshal(TPML_DIGEST_VALUES *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->count,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if (target->count < 5) {
      TVar1 = TPMT_HA_Array_Unmarshal(target->digests,buffer,size,0,target->count);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPML_DIGEST_VALUES_Unmarshal(TPML_DIGEST_VALUES *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > HASH_COUNT)
        return TPM_RC_SIZE;
    result = TPMT_HA_Array_Unmarshal((TPMT_HA *)(target->digests), buffer, size, 0, (INT32)(target->count));
    return result;
}